

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_sub_string(JSContext *ctx,JSString *p,int start,int end)

{
  uint uVar1;
  long lVar2;
  JSValueUnion JVar3;
  ushort uVar4;
  int64_t iVar5;
  JSRefCountHeader *p_1;
  ulong uVar6;
  uint len;
  JSValue JVar7;
  JSValue JVar8;
  
  uVar1 = (uint)*(undefined8 *)&p->field_0x4;
  if ((uVar1 & 0x7fffffff) == end && start == 0) {
    (p->header).ref_count = (p->header).ref_count + 1;
    iVar5 = -7;
    JVar3 = (JSValueUnion)p;
    goto LAB_0012cbb8;
  }
  len = end - start;
  if ((int)len < 1 || -1 < (int)uVar1) {
    JVar7 = js_new_string8(ctx,(uint8_t *)((long)&p[1].header.ref_count + (long)start),len);
LAB_0012cbac:
    iVar5 = JVar7.tag;
    JVar3 = JVar7.u;
  }
  else {
    if (start < end) {
      lVar2 = (long)start;
      uVar4 = 0;
      do {
        uVar4 = uVar4 | *(ushort *)((long)&p[1].header.ref_count + lVar2 * 2);
        lVar2 = lVar2 + 1;
      } while (end != lVar2);
      if (uVar4 < 0x100) goto LAB_0012cb70;
      JVar3.ptr = js_alloc_string(ctx,len,1);
      if ((JSString *)JVar3.ptr != (JSString *)0x0) {
        memcpy((JSString *)((long)JVar3.ptr + 0x10),
               (void *)((long)&p[1].header.ref_count + (long)start * 2),(ulong)(len * 2));
        iVar5 = -7;
        goto LAB_0012cbb8;
      }
    }
    else {
LAB_0012cb70:
      JVar3.ptr = js_alloc_string(ctx,len,0);
      if ((JSString *)JVar3.ptr != (JSString *)0x0) {
        uVar6 = 0;
        do {
          *(undefined1 *)((long)JVar3.ptr + uVar6 + 0x10) =
               *(undefined1 *)((long)&p[1].header.ref_count + uVar6 * 2 + (long)start * 2);
          uVar6 = uVar6 + 1;
        } while (len != uVar6);
        *(undefined1 *)((long)JVar3.ptr + (ulong)len + 0x10) = 0;
        JVar7.tag = -7;
        JVar7.u.ptr = JVar3.ptr;
        goto LAB_0012cbac;
      }
    }
    iVar5 = 6;
    JVar3.float64 = 0.0;
  }
LAB_0012cbb8:
  JVar8.tag = iVar5;
  JVar8.u.ptr = JVar3.ptr;
  return JVar8;
}

Assistant:

static JSValue js_sub_string(JSContext *ctx, JSString *p, int start, int end)
{
    int len = end - start;
    if (start == 0 && end == p->len) {
        return JS_DupValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
    }
    if (p->is_wide_char && len > 0) {
        JSString *str;
        int i;
        uint16_t c = 0;
        for (i = start; i < end; i++) {
            c |= p->u.str16[i];
        }
        if (c > 0xFF)
            return js_new_string16(ctx, p->u.str16 + start, len);

        str = js_alloc_string(ctx, len, 0);
        if (!str)
            return JS_EXCEPTION;
        for (i = 0; i < len; i++) {
            str->u.str8[i] = p->u.str16[start + i];
        }
        str->u.str8[len] = '\0';
        return JS_MKPTR(JS_TAG_STRING, str);
    } else {
        return js_new_string8(ctx, p->u.str8 + start, len);
    }
}